

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamStandardIndex::WriteHeader(BamStandardIndex *this)

{
  long lVar1;
  size_type sVar2;
  undefined8 uVar3;
  long in_RDI;
  int32_t numReferences;
  int64_t numBytesWritten;
  int32_t *in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [16];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  BamException *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [36];
  undefined4 local_14;
  long local_10;
  
  local_10 = 0;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x40))(*(long **)(in_RDI + 0x58),"BAI\x01",4);
  local_10 = lVar1 + local_10;
  sVar2 = std::
          vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
          ::size((vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                  *)(in_RDI + 0x38));
  local_14 = (undefined4)sVar2;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(in_stack_ffffffffffffff70);
  }
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x40))(*(long **)(in_RDI + 0x58),&local_14,4);
  local_10 = lVar1 + local_10;
  if (local_10 != 8) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"BamStandardIndex::WriteHeader",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"could not write BAI header",&local_71);
    BamException::BamException
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::WriteHeader()
{

    int64_t numBytesWritten = 0;

    // write magic number
    numBytesWritten += m_resources.Device->Write(BamStandardIndex::BAI_MAGIC, 4);

    // write number of reference sequences
    int32_t numReferences = m_indexFileSummary.size();
    if (m_isBigEndian) {
        SwapEndian_32(numReferences);
    }
    numBytesWritten +=
        m_resources.Device->Write((const char*)&numReferences, sizeof(numReferences));

    if (numBytesWritten != sizeof(numReferences) + 4) {
        throw BamException("BamStandardIndex::WriteHeader", "could not write BAI header");
    }
}